

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerPosixPipeConnection.cxx
# Opt level: O3

void __thiscall
cmDebugger::cmDebuggerPipeClient_POSIX::WaitForConnection(cmDebuggerPipeClient_POSIX *this)

{
  int iVar1;
  runtime_error *prVar2;
  int *piVar3;
  long *plVar4;
  long *plVar5;
  sockaddr_un addr;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  sockaddr local_98;
  long local_88;
  long lStack_80;
  undefined1 local_2b;
  
  iVar1 = socket(1,1,0);
  this->rw_pipe = iVar1;
  if (iVar1 < 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_d8 = &local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Failed to create socket: ","");
    piVar3 = __errno_location();
    strerror(*piVar3);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_98._0_8_ = *plVar4;
    plVar5 = plVar4 + 2;
    if ((long *)local_98._0_8_ == plVar5) {
      local_88 = *plVar5;
      lStack_80 = plVar4[3];
      local_98._0_8_ = &local_88;
    }
    else {
      local_88 = *plVar5;
    }
    local_98.sa_data._6_8_ = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::runtime_error::runtime_error(prVar2,(string *)&local_98);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_98.sa_family = 1;
  strncpy((char *)((long)&local_98 + 2),(this->PipeName)._M_dataplus._M_p,0x6c);
  local_2b = 0;
  iVar1 = connect(iVar1,&local_98,0x6e);
  if (iVar1 != -1) {
    return;
  }
  (**(code **)((long)(this->super_ReaderWriter).super_Reader + 0x18))(this);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"Failed to connect path to socket: ","");
  piVar3 = __errno_location();
  strerror(*piVar3);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_b8);
  local_d8 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_d8 == plVar5) {
    local_c8 = *plVar5;
    lStack_c0 = plVar4[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar5;
  }
  local_d0 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(prVar2,(string *)&local_d8);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void cmDebuggerPipeClient_POSIX::WaitForConnection()
{
  rw_pipe = socket(AF_UNIX, SOCK_STREAM, 0);
  if (rw_pipe < 0) {
    throw std::runtime_error(std::string("Failed to create socket: ") +
                             strerror(errno));
  }

  sockaddr_un addr;
  addr.sun_family = AF_UNIX;
  strncpy(addr.sun_path, PipeName.c_str(), sizeof(addr.sun_path));
  addr.sun_path[sizeof(addr.sun_path) - 1] = '\0';
  if (connect(rw_pipe, (sockaddr*)&addr, sizeof(addr)) == -1) {
    close();
    throw std::runtime_error(
      std::string("Failed to connect path to socket: ") + strerror(errno));
  }
}